

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

fdb_status wal_snapshot_clone(snap_handle *shandle_in,snap_handle **shandle_out,fdb_seqnum_t seqnum)

{
  fdb_status fVar1;
  
  if ((seqnum == 0xffffffffffffffff) ||
     (fVar1 = FDB_RESULT_INVALID_ARGS, shandle_in->seqnum == seqnum)) {
    LOCK();
    (shandle_in->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i =
         (shandle_in->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i + 1;
    UNLOCK();
    *shandle_out = shandle_in;
    fVar1 = FDB_RESULT_SUCCESS;
  }
  return fVar1;
}

Assistant:

fdb_status wal_snapshot_clone(struct snap_handle *shandle_in,
                              struct snap_handle **shandle_out,
                              fdb_seqnum_t seqnum)
{
    if (seqnum == FDB_SNAPSHOT_INMEM ||
        shandle_in->seqnum == seqnum) {
        atomic_incr_uint16_t(&shandle_in->ref_cnt_kvs);
        *shandle_out = shandle_in;
        return FDB_RESULT_SUCCESS;
    }
    return FDB_RESULT_INVALID_ARGS;
}